

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPSCQueue.h
# Opt level: O0

void __thiscall
rigtorp::SPSCQueue<TestType,_std::allocator<TestType>_>::~SPSCQueue
          (SPSCQueue<TestType,_std::allocator<TestType>_> *this)

{
  TestType *pTVar1;
  SPSCQueue<TestType,_std::allocator<TestType>_> *this_local;
  
  while( true ) {
    pTVar1 = front(this);
    if (pTVar1 == (TestType *)0x0) break;
    pop(this);
  }
  std::allocator_traits<std::allocator<TestType>_>::deallocate
            ((allocator_type *)this,this->slots_,this->capacity_ + 0x80);
  std::allocator<TestType>::~allocator((allocator<TestType> *)this);
  return;
}

Assistant:

~SPSCQueue() {
    while (front()) {
      pop();
    }
    std::allocator_traits<Allocator>::deallocate(allocator_, slots_,
                                                 capacity_ + 2 * kPadding);
  }